

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O1

int add_a_mem(em8051 *aCPU)

{
  uint uVar1;
  byte bVar2;
  uchar *puVar3;
  uint uVar4;
  
  bVar2 = aCPU->mCodeMem[(long)aCPU->mCodeMemSize - 1U & (long)aCPU->mPC + 1U];
  if ((long)(char)bVar2 < 0) {
    if (aCPU->sfrread == (em8051sfrread)0x0) {
      uVar4 = (uint)aCPU->mSFR[(ulong)bVar2 - 0x80];
    }
    else {
      uVar4 = (*aCPU->sfrread)(aCPU,(uint)bVar2);
    }
  }
  else {
    uVar4 = (uint)aCPU->mLowerData[(char)bVar2];
  }
  puVar3 = aCPU->mSFR;
  bVar2 = puVar3[0x60];
  uVar1 = (uVar4 & 0xff) + (uint)bVar2;
  puVar3[0x50] = ((((byte)uVar4 & 7) + (bVar2 & 7)) * '\b' & 0xc0) +
                 ((byte)((uVar4 & 0x7f) + (bVar2 & 0x7f) >> 7) ^ (byte)(uVar1 >> 8)) * '\x04' |
                 (byte)((uVar1 >> 8) << 7) | puVar3[0x50] & 0x3b;
  aCPU->mSFR[0x60] = aCPU->mSFR[0x60] + (byte)uVar4;
  aCPU->mPC = aCPU->mPC + 2;
  return 0;
}

Assistant:

static int add_a_mem(struct em8051 *aCPU)
{
    int value = read_mem(aCPU, OPERAND1);
    add_solve_flags(aCPU, ACC, value, 0);
    ACC += value;
	PC += 2;
    return 0;
}